

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawSwitchableImage::Tick
          (CommandDrawSwitchableImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  APlayerPawn *pAVar1;
  PClass *pPVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  player_t *ppVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  AInventory *pAVar8;
  PClassActor *pPVar9;
  AInventory *pAVar10;
  FTexture *pFVar11;
  APlayerPawn **ppAVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  byte bVar17;
  int iVar18;
  byte bVar19;
  long lVar20;
  FName species;
  undefined1 local_44 [16];
  FName local_34;
  
  local_44._4_8_ = block;
  switch(this->condition) {
  case WEAPONSLOT:
    ppVar6 = (statusBar->super_DBaseStatusBar).CPlayer;
    uVar13 = (ppVar6->weapons).Slots[this->conditionalValue[0]].Weapons.Count;
    uVar14 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar16 = 1;
    }
    else {
      ppAVar12 = &ppVar6->mo + (long)this->conditionalValue[0] * 2;
      uVar16 = 1;
      lVar20 = 0;
      uVar15 = 0;
      do {
        if (uVar15 < (uVar14 & 0xffffffff)) {
          pPVar9 = *(PClassActor **)
                    ((long)&(((FWeaponSlots *)(ppAVar12 + 0x3c))->Slots[0].Weapons.Array)->Type +
                    lVar20);
        }
        else {
          pPVar9 = (PClassActor *)0x0;
        }
        if (pPVar9 == (PClassActor *)0x0) {
          bVar3 = false;
        }
        else {
          pAVar10 = AActor::FindInventory(&ppVar6->mo->super_AActor,pPVar9,false);
          bVar3 = pAVar10 != (AInventory *)0x0;
          if (bVar3) {
            uVar16 = 0;
          }
        }
        if (bVar3) break;
        uVar15 = uVar15 + 1;
        ppVar6 = (statusBar->super_DBaseStatusBar).CPlayer;
        ppAVar12 = &ppVar6->mo + (long)this->conditionalValue[0] * 2;
        uVar14 = (ulong)(int)*(uint *)((long)ppAVar12 + 0x1ec);
        lVar20 = lVar20 + 0x10;
      } while ((long)uVar15 < (long)uVar14);
    }
    break;
  case INVULNERABILITY:
    uVar16 = (uint)((((statusBar->super_DBaseStatusBar).CPlayer)->cheats & 0x2000002U) != 0);
    break;
  case KEYSLOT:
    pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar10 = (pAVar1->super_AActor).Inventory.field_0.p;
    if ((pAVar10 != (AInventory *)0x0) &&
       (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar1->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar10 = (AInventory *)0x0;
    }
    if (pAVar10 == (AInventory *)0x0) {
      iVar18 = 0;
      bVar3 = false;
    }
    else {
      bVar3 = false;
      iVar18 = 0;
      do {
        pPVar2 = AKey::RegistrationInfo.MyClass;
        if ((pAVar10->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar5 = (**(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar10);
          (pAVar10->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var,iVar5);
        }
        pPVar7 = (pAVar10->super_AActor).super_DThinker.super_DObject.Class;
        bVar4 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar2 && bVar4) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar4 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar2) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        iVar5 = iVar18;
        if (bVar4) {
          bVar17 = pAVar10->field_0x4fc;
          if (bVar17 == 0) {
            AActor::GetSpecies((AActor *)local_44);
            if (local_44._0_4_ == this->keySpecies[0].Index) {
              bVar3 = true;
            }
            bVar4 = local_44._0_4_ == this->keySpecies[1].Index;
          }
          else {
            if (this->conditionalValue[0] == (uint)bVar17) {
              bVar3 = true;
            }
            bVar4 = this->conditionalValue[1] == (uint)bVar17;
          }
          if (bVar4) {
            iVar5 = 1;
          }
          if (this->conditionAnd == false) {
            iVar5 = iVar18;
          }
        }
        iVar18 = iVar5;
        pAVar8 = (pAVar10->super_AActor).Inventory.field_0.p;
        if ((pAVar8 != (AInventory *)0x0) &&
           (((pAVar8->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar10->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar8 = (AInventory *)0x0;
        }
        pAVar10 = pAVar8;
      } while (pAVar8 != (AInventory *)0x0);
    }
    if (this->conditionAnd == false) {
      uVar16 = (uint)(~bVar3 & 1);
    }
    else if (bVar3) {
      uVar16 = ((byte)~(byte)iVar18 & 1) * 2;
    }
    else {
      uVar16 = iVar18 * 2 + 1;
    }
    break;
  case ARMORTYPE:
    local_34.Index = 0x60;
    pAVar10 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,&local_34);
    if (pAVar10 == (AInventory *)0x0) {
      uVar16 = 0;
    }
    else {
      if (*(int *)((long)&pAVar10[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) ==
          this->armorType[0]) {
        bVar3 = EvaluateOperation(this->conditionalOperator,this->conditionalValue,&pAVar10->Amount)
        ;
      }
      else {
        bVar3 = false;
      }
      if (*(int *)((long)&pAVar10[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) ==
          this->armorType[1]) {
        bVar4 = EvaluateOperation(this->conditionalOperator + 1,this->conditionalValue + 1,
                                  &pAVar10->Amount);
      }
      else {
        bVar4 = false;
      }
      if (this->conditionAnd == true) {
        uVar13 = 3;
        if (bVar3 != false) {
          uVar13 = (uint)(bVar4 ^ 1U) + (uint)(bVar4 ^ 1U) * 2;
        }
        uVar16 = bVar3 + 1;
        if (bVar4 != false) {
          uVar16 = uVar13;
        }
      }
      else {
        uVar16 = (uint)(bVar3 ^ 1);
      }
    }
    break;
  default:
    pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pPVar9 = PClass::FindActor(this->inventoryItem);
    uVar13 = 0;
    pAVar10 = AActor::FindInventory(&pAVar1->super_AActor,pPVar9,false);
    if ((pAVar10 == (AInventory *)0x0) ||
       (bVar3 = EvaluateOperation(this->conditionalOperator,this->conditionalValue,&pAVar10->Amount)
       , !bVar3)) {
      uVar13 = 1;
      bVar19 = 1;
      bVar17 = 0;
    }
    else {
      bVar17 = 1;
      bVar19 = 0;
    }
    uVar16 = uVar13;
    if (this->conditionAnd == true) {
      pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
      pPVar9 = PClass::FindActor(this->inventoryItem + 1);
      pAVar10 = AActor::FindInventory(&pAVar1->super_AActor,pPVar9,false);
      if (pAVar10 == (AInventory *)0x0) {
        bVar3 = false;
      }
      else {
        bVar3 = EvaluateOperation(this->conditionalOperator + 1,this->conditionalValue + 1,
                                  &pAVar10->Amount);
      }
      uVar16 = 0;
      if (((pAVar10 != (AInventory *)0x0 & bVar17 & bVar3) == 0) &&
         (uVar16 = 3, (pAVar10 != (AInventory *)0x0 & bVar19 & bVar3) == 0)) {
        if (pAVar10 == (AInventory *)0x0) {
          uVar13 = 1;
        }
        else {
          bVar17 = bVar17 & (bVar3 ^ 1U);
        }
        uVar16 = uVar13;
        if (bVar17 != 0) {
          uVar16 = 2;
        }
      }
    }
  }
  if (uVar16 == 0) {
    CommandDrawImage::Tick
              (&this->super_CommandDrawImage,(SBarInfoMainBlock *)local_44._4_8_,statusBar,
               hudChanged);
  }
  else {
    pFVar11 = FImageCollection::operator[](&statusBar->Images,this->conditionalImage[uVar16 - 1]);
    (this->super_CommandDrawImage).texture = pFVar11;
    (this->super_CommandDrawImage).alpha = 1.0;
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			// DrawSwitchable image allows 2 or 4 images to be supplied.
			// drawAlt toggles these:
			// 1 = first image
			// 2 = second image
			// 3 = thrid image
			// 0 = last image
			int drawAlt = 0;
			if(condition == WEAPONSLOT) //weaponslots
			{
				drawAlt = 1; //draw off state until we know we have something.
				for (int i = 0; i < statusBar->CPlayer->weapons.Slots[conditionalValue[0]].Size(); i++)
				{
					PClassActor *weap = statusBar->CPlayer->weapons.Slots[conditionalValue[0]].GetWeapon(i);
					if(weap == NULL)
					{
						continue;
					}
					else if(statusBar->CPlayer->mo->FindInventory(weap) != NULL)
					{
						drawAlt = 0;
						break;
					}
				}
			}
			else if(condition == INVULNERABILITY)
			{
				if(statusBar->CPlayer->cheats&(CF_GODMODE|CF_GODMODE2))
				{
					drawAlt = 1;
				}
			}
			else if(condition == KEYSLOT)
			{
				bool found1 = false;
				bool found2 = false;
				drawAlt = 1;

				for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
				{
					if(item->IsKindOf(RUNTIME_CLASS(AKey)))
					{
						int keynum = static_cast<AKey *>(item)->KeyNumber;
						if(keynum)
						{
							if(keynum == conditionalValue[0])
								found1 = true;
							if(conditionAnd && keynum == conditionalValue[1]) // two keys
								found2 = true;
						}
						else
						{
							FName species = item->GetSpecies();
							if(species == keySpecies[0])
								found1 = true;
							if(conditionAnd && species == keySpecies[1])
								found2 = true;
						}
					}
				}

				if(conditionAnd)
				{
					if(found1 && found2)
						drawAlt = 0;
					else if(found1)
						drawAlt = 2;
					else if(found2)
						drawAlt = 3;
				}
				else
				{
					if(found1)
						drawAlt = 0;
				}
			}
			else if(condition == ARMORTYPE)
			{
				ABasicArmor *armor = (ABasicArmor *) statusBar->CPlayer->mo->FindInventory(NAME_BasicArmor);
				if(armor != NULL)
				{
					bool matches1 = armor->ArmorType.GetIndex() == armorType[0] && EvaluateOperation(conditionalOperator[0], conditionalValue[0], armor->Amount);
					bool matches2 = armor->ArmorType.GetIndex() == armorType[1] && EvaluateOperation(conditionalOperator[1], conditionalValue[1], armor->Amount);

					drawAlt = 1;
					if(conditionAnd)
					{
						if(matches1 && matches2)
							drawAlt = 0;
						else if(matches2)
							drawAlt = 3;
						else if(matches1)
							drawAlt = 2;
					}
					else if(matches1)
						drawAlt = 0;
				}
			}
			else //check the inventory items and draw selected sprite
			{
				AInventory* item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(inventoryItem[0]));
				if(item == NULL || !EvaluateOperation(conditionalOperator[0], conditionalValue[0], item->Amount))
					drawAlt = 1;
				if(conditionAnd)
				{
					item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(inventoryItem[1]));
					bool secondCondition = item != NULL && EvaluateOperation(conditionalOperator[1], conditionalValue[1], item->Amount);
					if((item != NULL && secondCondition) && drawAlt == 0) //both
					{
						drawAlt = 0;
					}
					else if((item != NULL && secondCondition) && drawAlt == 1) //2nd
					{
						drawAlt = 3;
					}
					else if((item == NULL || !secondCondition) && drawAlt == 0) //1st
					{
						drawAlt = 2;
					}
				}
			}
			if(drawAlt != 0) //draw 'off' image
			{
				texture = statusBar->Images[conditionalImage[drawAlt-1]];

				// Since we're not going to call our parent's tick() method,
				// be sure to set the alpha value properly.
				alpha = 1.;
				return;
			}
			CommandDrawImage::Tick(block, statusBar, hudChanged);
		}